

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O0

void helper_divw_AX_x86_64(CPUX86State *env,target_ulong t0)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uintptr_t unaff_retaddr;
  uint r;
  uint q;
  uint den;
  uint num;
  target_ulong t0_local;
  CPUX86State *env_local;
  
  uVar1 = (uint)env->regs[0] & 0xffff | (uint)((env->regs[2] & 0xffff) << 0x10);
  uVar2 = (uint)t0 & 0xffff;
  if ((t0 & 0xffff) == 0) {
    raise_exception_ra_x86_64(env,0,unaff_retaddr);
  }
  uVar3 = uVar1 / uVar2;
  if (0xffff < uVar3) {
    raise_exception_ra_x86_64(env,0,unaff_retaddr);
  }
  env->regs[0] = env->regs[0] & 0xffffffffffff0000 | (ulong)(uVar3 & 0xffff);
  env->regs[2] = env->regs[2] & 0xffffffffffff0000 | (ulong)(uVar1 % uVar2);
  return;
}

Assistant:

void helper_divw_AX(CPUX86State *env, target_ulong t0)
{
    unsigned int num, den, q, r;

    num = (env->regs[R_EAX] & 0xffff) | ((env->regs[R_EDX] & 0xffff) << 16);
    den = (t0 & 0xffff);
    if (den == 0) {
        raise_exception_ra(env, EXCP00_DIVZ, GETPC());
    }
    q = (num / den);
    if (q > 0xffff) {
        raise_exception_ra(env, EXCP00_DIVZ, GETPC());
    }
    q &= 0xffff;
    r = (num % den) & 0xffff;
    env->regs[R_EAX] = (env->regs[R_EAX] & ~0xffff) | q;
    env->regs[R_EDX] = (env->regs[R_EDX] & ~0xffff) | r;
}